

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O0

void __thiscall
gimage::PNMImageIO::load
          (PNMImageIO *this,ImageU16 *image,char *name,int ds,long x,long y,long w,long h)

{
  int j_00;
  long k_00;
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  _Ios_Iostate __a;
  uint uVar4;
  ulong uVar5;
  undefined8 uVar6;
  int *piVar7;
  long *plVar8;
  int in_ECX;
  char *in_RDX;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  pos_type pVar9;
  fpos<__mbstate_t> fVar10;
  long in_stack_00000008;
  long in_stack_00000010;
  ImageU8 imageu8;
  failure *ex;
  store_t_conflict v_1;
  int d_2;
  long i_2;
  long k_1;
  streambuf *sb_1;
  int d_1;
  long i_1;
  long j;
  store_t_conflict v;
  int d;
  int ii;
  long i;
  long j_1;
  streambuf *sb;
  long kk;
  long k;
  valarray<int> nline;
  valarray<int> vline;
  ifstream in;
  pos_type pos;
  int depth;
  float scale;
  long maxval;
  long height;
  long width;
  fpos<__mbstate_t> *in_stack_fffffffffffff988;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_fffffffffffff990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff998;
  valarray<int> *in_stack_fffffffffffff9a0;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this_00;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_fffffffffffff9b0;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9cc;
  IOException *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  int iVar11;
  long in_stack_fffffffffffff9e0;
  long in_stack_fffffffffffff9e8;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this_01;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_fffffffffffff9f0;
  long i_00;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_500;
  ushort local_496;
  int local_494;
  long local_490;
  long local_488;
  undefined8 local_480;
  undefined4 local_478;
  undefined4 uStack_474;
  int iStack_470;
  anon_union_4_2_91654ee9_for___value aStack_46c;
  int local_45c;
  long local_458 [3];
  long local_440 [3];
  ushort local_422;
  int local_420;
  int local_41c;
  long local_418 [3];
  long local_400 [3];
  undefined8 local_3e8;
  long local_3e0;
  fpos<__mbstate_t> local_3d8;
  fpos<__mbstate_t> local_3c8;
  long local_3b8;
  undefined4 local_3b0;
  undefined4 local_3ac;
  long local_3a8 [3];
  undefined4 local_38c;
  valarray<int> local_388;
  undefined4 local_374;
  valarray<int> local_370;
  long local_360 [65];
  int local_158;
  undefined1 local_152;
  allocator local_151;
  string local_150 [96];
  pos_type local_f0;
  undefined1 local_dd;
  allocator local_c9;
  string local_c8 [40];
  long *in_stack_ffffffffffffff60;
  long *in_stack_ffffffffffffff68;
  float *in_stack_ffffffffffffff70;
  long *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  anon_union_4_2_91654ee9_for___value aStack_5c;
  int local_58;
  float local_54;
  long local_50;
  long local_48;
  long local_40;
  long local_30;
  int local_24;
  char *local_20;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_18;
  
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)0x168f14);
  uVar5 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_20,1);
  if ((uVar5 & 1) == 0) {
    local_dd = 1;
    uVar6 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,local_20,&local_c9);
    std::operator+((char *)in_stack_fffffffffffff998,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff990);
    std::operator+(in_stack_fffffffffffff998,(char *)in_stack_fffffffffffff990);
    gutil::IOException::IOException
              (in_stack_fffffffffffff9d0,
               (string *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    local_dd = 0;
    __cxa_throw(uVar6,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  pVar9 = anon_unknown_11::readPNMHeader
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                     in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  local_f0 = pVar9;
  if ((local_54 == 0.0) && (!NAN(local_54))) {
    if (local_50 < 0x100) {
      this_00 = &local_500;
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
                (this_00,(long)in_stack_fffffffffffff998,(long)in_stack_fffffffffffff990,
                 (int)((ulong)in_stack_fffffffffffff988 >> 0x20));
      (**(code **)(*in_RDI + 0x30))
                (in_RDI,this_00,local_20,local_24,local_30,in_R9,in_stack_00000008,in_stack_00000010
                );
      Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setImageLimited<unsigned_char>
                ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
                 CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                 in_stack_fffffffffffff9b8);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(this_00);
    }
    else {
      local_158 = 1;
      piVar7 = std::max<int>(&local_158,&local_24);
      local_24 = *piVar7;
      if (in_stack_00000008 < 0) {
        in_stack_00000008 = (local_40 + local_24 + -1) / (long)local_24;
      }
      if (in_stack_00000010 < 0) {
        in_stack_00000010 = (local_48 + local_24 + -1) / (long)local_24;
      }
      Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
                (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                 CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
      Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::clear(in_stack_fffffffffffff9b0);
      std::ifstream::ifstream(local_360);
      uVar6 = *(undefined8 *)(local_360[0] + -0x18);
      __a = std::operator|(_S_failbit,_S_badbit);
      std::operator|(__a,_S_eofbit);
      std::ios::exceptions((int)local_360 + (int)uVar6);
      std::ifstream::open((char *)local_360,(_Ios_Openmode)local_20);
      if ((((local_24 < 2) && (local_30 == 0)) && (in_R9 == 0)) &&
         ((in_stack_00000008 == local_40 && (in_stack_00000010 == local_48)))) {
        local_68 = (undefined4)pVar9._M_off;
        uStack_64 = pVar9._M_off._4_4_;
        iStack_60 = pVar9._M_state.__count;
        aStack_5c.__wch = pVar9._M_state.__value;
        local_478 = local_68;
        uStack_474 = uStack_64;
        iStack_470 = iStack_60;
        aStack_46c.__wch = aStack_5c.__wch;
        std::istream::seekg(local_360,pVar9._M_off,pVar9._M_state);
        local_480 = std::ifstream::rdbuf();
        local_488 = 0;
        while( true ) {
          if (local_48 <= local_488) break;
          for (local_490 = 0; local_490 < local_40; local_490 = local_490 + 1) {
            for (local_494 = 0; local_494 < local_58; local_494 = local_494 + 1) {
              local_496 = std::streambuf::sbumpc();
              local_496 = local_496 & 0xff;
              uVar3 = local_496 << 8;
              uVar2 = std::streambuf::sbumpc();
              local_496 = uVar3 | uVar2 & 0xff;
              Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::set
                        (local_18,local_490,local_488,local_494,local_496);
            }
          }
          local_488 = local_488 + 1;
        }
      }
      else {
        local_374 = 0;
        std::valarray<int>::valarray
                  (in_stack_fffffffffffff9a0,(int *)in_stack_fffffffffffff998,
                   (size_t)in_stack_fffffffffffff990);
        local_38c = 0;
        std::valarray<int>::valarray
                  (in_stack_fffffffffffff9a0,(int *)in_stack_fffffffffffff998,
                   (size_t)in_stack_fffffffffffff990);
        local_3a8[1] = 0;
        local_3a8[0] = -in_R9;
        plVar8 = std::max<long>(local_3a8 + 1,local_3a8);
        for (local_3a8[2] = *plVar8;
            local_3a8[2] < in_stack_00000010 && (in_R9 + local_3a8[2]) * (long)local_24 < local_48;
            local_3a8[2] = local_3a8[2] + 1) {
          local_3ac = 0;
          std::valarray<int>::operator=
                    ((valarray<int> *)in_stack_fffffffffffff990,(int *)in_stack_fffffffffffff988);
          local_3b0 = 0;
          std::valarray<int>::operator=
                    ((valarray<int> *)in_stack_fffffffffffff990,(int *)in_stack_fffffffffffff988);
          local_3b8 = 0;
          while( true ) {
            bVar1 = false;
            if (local_3b8 < local_24) {
              bVar1 = local_3b8 + (in_R9 + local_3a8[2]) * (long)local_24 < local_48;
            }
            if (!bVar1) break;
            fVar10 = std::fpos<__mbstate_t>::operator+(in_stack_fffffffffffff988,0x169687);
            local_3e0 = 0;
            local_3d8 = fVar10;
            std::max<long>(&local_3e0,&local_30);
            fVar10 = std::fpos<__mbstate_t>::operator+(in_stack_fffffffffffff988,0x169717);
            local_3c8 = fVar10;
            std::istream::seekg(local_360,fVar10._M_off,fVar10._M_state);
            local_3e8 = std::ifstream::rdbuf();
            local_400[1] = 0;
            local_400[0] = -local_30;
            plVar8 = std::max<long>(local_400 + 1,local_400);
            local_400[2] = *plVar8 * (long)local_58;
            local_418[1] = 0;
            local_418[0] = -local_30;
            plVar8 = std::max<long>(local_418 + 1,local_418);
            for (local_418[2] = *plVar8;
                local_418[2] < in_stack_00000008 &&
                (local_30 + local_418[2]) * (long)local_24 < local_40;
                local_418[2] = local_418[2] + 1) {
              local_41c = 0;
              while( true ) {
                bVar1 = false;
                if (local_41c < local_24) {
                  bVar1 = (local_30 + local_418[2]) * (long)local_24 + (long)local_41c < local_40;
                }
                if (!bVar1) break;
                for (local_420 = 0; local_420 < local_58; local_420 = local_420 + 1) {
                  local_422 = std::streambuf::sbumpc();
                  local_422 = local_422 & 0xff;
                  uVar3 = local_422 << 8;
                  uVar2 = std::streambuf::sbumpc();
                  local_422 = uVar3 | uVar2 & 0xff;
                  bVar1 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::isValidS
                                    (in_stack_fffffffffffff990,
                                     (store_t_conflict)((ulong)in_stack_fffffffffffff988 >> 0x30));
                  if (bVar1) {
                    uVar4 = (uint)local_422;
                    piVar7 = std::valarray<int>::operator[](&local_370,local_400[2] + local_420);
                    *piVar7 = *piVar7 + uVar4;
                    piVar7 = std::valarray<int>::operator[](&local_388,local_400[2] + local_420);
                    *piVar7 = *piVar7 + 1;
                  }
                }
                local_41c = local_41c + 1;
              }
              local_400[2] = local_58 + local_400[2];
            }
            local_3b8 = local_3b8 + 1;
          }
          local_440[1] = 0;
          local_440[0] = -local_30;
          plVar8 = std::max<long>(local_440 + 1,local_440);
          local_440[2] = *plVar8 * (long)local_58;
          local_458[1] = 0;
          local_458[0] = -local_30;
          plVar8 = std::max<long>(local_458 + 1,local_458);
          for (local_458[2] = *plVar8;
              local_458[2] < in_stack_00000008 &&
              (local_30 + local_458[2]) * (long)local_24 < local_40; local_458[2] = local_458[2] + 1
              ) {
            for (local_45c = 0; local_45c < local_58; local_45c = local_45c + 1) {
              piVar7 = std::valarray<int>::operator[](&local_388,local_440[2]);
              k_00 = local_3a8[2];
              j_00 = local_45c;
              if (0 < *piVar7) {
                this_01 = local_18;
                i_00 = local_458[2];
                piVar7 = std::valarray<int>::operator[](&local_370,local_440[2]);
                iVar11 = *piVar7;
                piVar7 = std::valarray<int>::operator[](&local_388,local_440[2]);
                Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::set
                          (this_01,i_00,k_00,j_00,(store_t_conflict)(iVar11 / *piVar7));
              }
              local_440[2] = local_440[2] + 1;
            }
          }
        }
        std::valarray<int>::~valarray((valarray<int> *)in_stack_fffffffffffff990);
        std::valarray<int>::~valarray((valarray<int> *)in_stack_fffffffffffff990);
      }
      std::ifstream::close();
      std::ifstream::~ifstream(local_360);
    }
    return;
  }
  local_152 = 1;
  uVar6 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,local_20,&local_151);
  std::operator+((char *)in_stack_fffffffffffff998,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff990);
  std::operator+(in_stack_fffffffffffff998,(char *)in_stack_fffffffffffff990);
  gutil::IOException::IOException
            (in_stack_fffffffffffff9d0,
             (string *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  local_152 = 0;
  __cxa_throw(uVar6,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void PNMImageIO::load(ImageU16 &image, const char *name, int ds, long x,
                      long y, long w, long h) const
{
  long  width, height, maxval;
  float scale;
  int   depth;
  std::istream::pos_type pos;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNM image ("+std::string(name)+")");
  }

  pos=readPNMHeader(name, depth, maxval, scale, width, height);

  if (scale != 0)
  {
    throw gutil::IOException("A float image cannot be loaded as 16 bit image ("+std::string(name)+")");
  }

  if (maxval > 255)
  {
    ds=std::max(1, ds);

    if (w < 0)
    {
      w=(width+ds-1)/ds;
    }

    if (h < 0)
    {
      h=(height+ds-1)/ds;
    }

    image.setSize(w, h, depth);
    image.clear();

    try
    {
      std::ifstream in;
      in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
      in.open(name, std::ios::binary);

      // load downscaled part?

      if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
      {
        std::valarray<ImageU16::work_t> vline(0, w*depth);
        std::valarray<int> nline(0, w*depth);

        for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
        {
          // load downscaled line

          vline=0;
          nline=0;

          for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
          {
            in.seekg(pos+static_cast<std::streamoff>((y+k)*ds+kk)*width*depth*2+
                     static_cast<std::streamoff>(std::max(0l, x))*ds*depth*2);

            std::streambuf *sb=in.rdbuf();

            long j=std::max(0l, -x)*depth;

            for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
            {
              for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
              {
                for (int d=0; d<depth; d++)
                {
                  ImageU16::store_t v;

                  v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
                  v=(v<<8)|(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);

                  if (image.isValidS(v))
                  {
                    vline[j+d]+=v;
                    nline[j+d]++;
                  }
                }
              }

              j+=depth;
            }
          }

          // store line into image

          long j=std::max(0l, -x)*depth;

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              if (nline[j] > 0)
              {
                image.set(i, k, d, static_cast<ImageU16::store_t>(vline[j]/nline[j]));
              }

              j++;
            }
          }
        }
      }
      else // load whole image
      {
        in.seekg(pos);
        std::streambuf *sb=in.rdbuf();

        for (long k=0; k<height; k++)
        {
          for (long i=0; i<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              ImageU16::store_t v;

              v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
              v=(v<<8)|(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);

              image.set(i, k, d, v);
            }
          }
        }
      }

      in.close();
    }
    catch (const std::ios_base::failure &ex)
    {
      throw gutil::IOException(ex.what());
    }
  }
  else
  {
    ImageU8 imageu8;
    load(imageu8, name, ds, x, y, w, h);
    image.setImageLimited(imageu8);
  }
}